

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QRingChunk>::reallocateAndGrow
          (QArrayDataPointer<QRingChunk> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QRingChunk> *old)

{
  QArrayData *data;
  Data *pDVar1;
  char *pcVar2;
  Data *pDVar3;
  QRingChunk *pQVar4;
  bool bVar5;
  QRingChunk *pQVar6;
  qsizetype qVar7;
  long lVar8;
  long in_FS_OFFSET;
  pair<QArrayData_*,_void_*> pVar9;
  QArrayDataPointer<QRingChunk> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QRingChunk> *)0x0 && where == GrowsAtEnd) {
    data = &this->d->super_QArrayData;
    if (data == (QArrayData *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = 1 < (data->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar5)) {
      if (data == (QArrayData *)0x0) {
        qVar7 = 0;
        lVar8 = 0;
      }
      else {
        qVar7 = data->alloc;
        lVar8 = (this->size - data->alloc) +
                ((long)((long)this->ptr - ((ulong)((long)&data[1].alloc + 7U) & 0xfffffffffffffff0))
                >> 3) * -0x3333333333333333;
      }
      pVar9 = QArrayData::reallocateUnaligned(data,this->ptr,0x28,qVar7 + n + lVar8,Grow);
      this->d = (Data *)pVar9.first;
      this->ptr = (QRingChunk *)pVar9.second;
      goto LAB_0012885b;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QRingChunk *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar8 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pQVar6 = this->ptr;
    pQVar4 = pQVar6 + lVar8;
    if ((old != (QArrayDataPointer<QRingChunk> *)0x0) || (bVar5)) {
      if ((lVar8 != 0) && (0 < lVar8)) {
        do {
          pDVar1 = (pQVar6->chunk).d.d;
          local_38.ptr[local_38.size].chunk.d.d = pDVar1;
          local_38.ptr[local_38.size].chunk.d.ptr = (pQVar6->chunk).d.ptr;
          local_38.ptr[local_38.size].chunk.d.size = (pQVar6->chunk).d.size;
          if (pDVar1 != (Data *)0x0) {
            LOCK();
            (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                 (__atomic_base<int>)
                 ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1)
            ;
            UNLOCK();
          }
          qVar7 = pQVar6->tailOffset;
          local_38.ptr[local_38.size].headOffset = pQVar6->headOffset;
          local_38.ptr[local_38.size].tailOffset = qVar7;
          pQVar6 = pQVar6 + 1;
          local_38.size = local_38.size + 1;
        } while (pQVar6 < pQVar4);
      }
    }
    else if ((lVar8 != 0) && (0 < lVar8)) {
      do {
        pDVar1 = (pQVar6->chunk).d.d;
        (pQVar6->chunk).d.d = (Data *)0x0;
        local_38.ptr[local_38.size].chunk.d.d = pDVar1;
        pcVar2 = (pQVar6->chunk).d.ptr;
        (pQVar6->chunk).d.ptr = (char *)0x0;
        local_38.ptr[local_38.size].chunk.d.ptr = pcVar2;
        qVar7 = (pQVar6->chunk).d.size;
        (pQVar6->chunk).d.size = 0;
        local_38.ptr[local_38.size].chunk.d.size = qVar7;
        qVar7 = pQVar6->tailOffset;
        local_38.ptr[local_38.size].headOffset = pQVar6->headOffset;
        (&local_38.ptr[local_38.size].headOffset)[1] = qVar7;
        pQVar6 = pQVar6 + 1;
        local_38.size = local_38.size + 1;
      } while (pQVar6 < pQVar4);
    }
  }
  pDVar3 = this->d;
  pQVar4 = this->ptr;
  this->d = local_38.d;
  this->ptr = local_38.ptr;
  qVar7 = this->size;
  this->size = local_38.size;
  local_38.d = pDVar3;
  local_38.ptr = pQVar4;
  local_38.size = qVar7;
  if (old != (QArrayDataPointer<QRingChunk> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = pDVar3;
    old->ptr = pQVar4;
    local_38.size = old->size;
    old->size = qVar7;
  }
  ~QArrayDataPointer(&local_38);
LAB_0012885b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }